

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

void __thiscall xmrig::Api::genId(Api *this,String *id)

{
  uint16_t uVar1;
  int iVar2;
  Config *pCVar3;
  uint16_t *in;
  long lVar4;
  int count;
  uv_interface_address_t *interfaces;
  uint8_t hash [200];
  
  this->m_id[0x10] = '\0';
  this->m_id[0x11] = '\0';
  this->m_id[0x12] = '\0';
  this->m_id[0x13] = '\0';
  this->m_id[0x14] = '\0';
  this->m_id[0x15] = '\0';
  this->m_id[0x16] = '\0';
  this->m_id[0x17] = '\0';
  this->m_id[0x18] = '\0';
  this->m_id[0x19] = '\0';
  this->m_id[0x1a] = '\0';
  this->m_id[0x1b] = '\0';
  this->m_id[0x1c] = '\0';
  this->m_id[0x1d] = '\0';
  this->m_id[0x1e] = '\0';
  this->m_id[0x1f] = '\0';
  this->m_id[0] = '\0';
  this->m_id[1] = '\0';
  this->m_id[2] = '\0';
  this->m_id[3] = '\0';
  this->m_id[4] = '\0';
  this->m_id[5] = '\0';
  this->m_id[6] = '\0';
  this->m_id[7] = '\0';
  this->m_id[8] = '\0';
  this->m_id[9] = '\0';
  this->m_id[10] = '\0';
  this->m_id[0xb] = '\0';
  this->m_id[0xc] = '\0';
  this->m_id[0xd] = '\0';
  this->m_id[0xe] = '\0';
  this->m_id[0xf] = '\0';
  if (id->m_size != 0) {
    strncpy(this->m_id,id->m_data,0x1f);
    return;
  }
  iVar2 = uv_interface_addresses(&interfaces);
  if (-1 < iVar2) {
    for (lVar4 = 0; lVar4 != 0; lVar4 = lVar4 + 0x50) {
      if ((*(int *)(interfaces->phys_addr + lVar4 + 8) == 0) &&
         (*(short *)(interfaces->phys_addr + lVar4 + 0xc) == 2)) {
        pCVar3 = Base::config(this->m_base);
        uVar1 = (pCVar3->super_BaseConfig).m_http.m_port;
        in = (uint16_t *)operator_new__(0xd);
        *in = uVar1;
        *(undefined4 *)(in + 1) = *(undefined4 *)(interfaces->phys_addr + lVar4);
        in[3] = *(uint16_t *)(interfaces->phys_addr + lVar4 + 4);
        in[4] = 0x696d;
        in[5] = 0x656e;
        *(undefined1 *)(in + 6) = 0x72;
        keccak((uint8_t *)in,0xd,hash);
        Buffer::toHex(hash,8,(uint8_t *)this->m_id);
        operator_delete__(in);
        break;
      }
    }
    uv_free_interface_addresses(interfaces,0);
  }
  return;
}

Assistant:

void xmrig::Api::genId(const String &id)
{
    memset(m_id, 0, sizeof(m_id));

    if (id.size() > 0) {
        strncpy(m_id, id.data(), sizeof(m_id) - 1);
        return;
    }

    uv_interface_address_t *interfaces;
    int count = 0;

    if (uv_interface_addresses(&interfaces, &count) < 0) {
        return;
    }

    for (int i = 0; i < count; i++) {
        if (!interfaces[i].is_internal && interfaces[i].address.address4.sin_family == AF_INET) {
            uint8_t hash[200];
            const size_t addrSize = sizeof(interfaces[i].phys_addr);
            const size_t inSize   = strlen(APP_KIND) + addrSize + sizeof(uint16_t);
            const uint16_t port   = static_cast<uint16_t>(m_base->config()->http().port());

            uint8_t *input = new uint8_t[inSize]();
            memcpy(input, &port, sizeof(uint16_t));
            memcpy(input + sizeof(uint16_t), interfaces[i].phys_addr, addrSize);
            memcpy(input + sizeof(uint16_t) + addrSize, APP_KIND, strlen(APP_KIND));

            keccak(input, inSize, hash);
            Buffer::toHex(hash, 8, m_id);

            delete [] input;
            break;
        }
    }

    uv_free_interface_addresses(interfaces, count);
}